

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int resolveOrderGroupBy(NameContext *pNC,Select *pSelect,ExprList *pOrderBy,char *zType)

{
  Expr *pExpr;
  int iVar1;
  int iVar2;
  ExprList_item *pEVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ExprList_item *pEVar8;
  Expr *p;
  ExprList *pEVar9;
  int iCol;
  int local_64;
  char *local_60;
  uint local_54;
  Parse *local_50;
  NameContext *local_48;
  Expr *local_40;
  ulong local_38;
  
  if (pOrderBy == (ExprList *)0x0) {
    return 0;
  }
  local_50 = pNC->pParse;
  local_60 = zType;
  local_48 = pNC;
  if (0 < pOrderBy->nExpr) {
    local_54 = pSelect->pEList->nExpr;
    pEVar3 = pOrderBy->a;
    uVar6 = 0;
    local_40 = (Expr *)pOrderBy;
    do {
      pExpr = pEVar3->pExpr;
      p = pExpr;
      while (p != (Expr *)0x0) {
        if ((p->flags >> 0xc & 1) == 0) goto LAB_0015af0d;
        if ((p->flags >> 0x12 & 1) == 0) {
          pEVar8 = (ExprList_item *)&p->pLeft;
        }
        else {
          pEVar8 = ((p->x).pList)->a;
        }
        p = pEVar8->pExpr;
      }
      p = (Expr *)0x0;
LAB_0015af0d:
      local_38 = uVar6;
      if ((*local_60 == 'G') ||
         (local_64 = resolveAsName((Parse *)pSelect->pEList,(ExprList *)p,local_40), local_64 < 1))
      {
        iVar1 = sqlite3ExprIsInteger(p,&local_64);
        if (iVar1 != 0) {
          if (local_64 - 0x10000U < 0xffff0001) {
            sqlite3ErrorMsg(local_50,"%r %s BY term out of range - should be between 1 and %d",
                            (ulong)((int)uVar6 + 1),local_60,(ulong)local_54);
            return 1;
          }
          goto LAB_0015af59;
        }
        (pEVar3->u).x.iOrderByCol = 0;
        iVar1 = sqlite3ResolveExprNames(local_48,pExpr);
        if (iVar1 != 0) {
          return 1;
        }
        pEVar9 = pSelect->pEList;
        iVar1 = pEVar9->nExpr;
        if (0 < iVar1) {
          lVar7 = 0;
          lVar4 = 0;
          do {
            iVar2 = sqlite3ExprCompare(pExpr,*(Expr **)((long)&pEVar9->a->pExpr + lVar7),-1);
            if (iVar2 == 0) {
              (pEVar3->u).x.iOrderByCol = (short)lVar4 + 1;
              pEVar9 = pSelect->pEList;
              iVar1 = pEVar9->nExpr;
            }
            lVar4 = lVar4 + 1;
            lVar7 = lVar7 + 0x20;
          } while (lVar4 < iVar1);
        }
      }
      else {
LAB_0015af59:
        (pEVar3->u).x.iOrderByCol = (u16)local_64;
      }
      uVar5 = (int)local_38 + 1;
      uVar6 = (ulong)uVar5;
      pEVar3 = pEVar3 + 1;
      iVar1._0_1_ = local_40->op;
      iVar1._1_1_ = local_40->affinity;
      iVar1._2_2_ = *(undefined2 *)&local_40->field_0x2;
      pOrderBy = (ExprList *)local_40;
    } while ((int)uVar5 < iVar1);
  }
  iVar1 = sqlite3ResolveOrderGroupBy(local_50,pSelect,pOrderBy,local_60);
  return iVar1;
}

Assistant:

static int resolveOrderGroupBy(
  NameContext *pNC,     /* The name context of the SELECT statement */
  Select *pSelect,      /* The SELECT statement holding pOrderBy */
  ExprList *pOrderBy,   /* An ORDER BY or GROUP BY clause to resolve */
  const char *zType     /* Either "ORDER" or "GROUP", as appropriate */
){
  int i, j;                      /* Loop counters */
  int iCol;                      /* Column number */
  struct ExprList_item *pItem;   /* A term of the ORDER BY clause */
  Parse *pParse;                 /* Parsing context */
  int nResult;                   /* Number of terms in the result set */

  if( pOrderBy==0 ) return 0;
  nResult = pSelect->pEList->nExpr;
  pParse = pNC->pParse;
  for(i=0, pItem=pOrderBy->a; i<pOrderBy->nExpr; i++, pItem++){
    Expr *pE = pItem->pExpr;
    Expr *pE2 = sqlite3ExprSkipCollate(pE);
    if( zType[0]!='G' ){
      iCol = resolveAsName(pParse, pSelect->pEList, pE2);
      if( iCol>0 ){
        /* If an AS-name match is found, mark this ORDER BY column as being
        ** a copy of the iCol-th result-set column.  The subsequent call to
        ** sqlite3ResolveOrderGroupBy() will convert the expression to a
        ** copy of the iCol-th result-set expression. */
        pItem->u.x.iOrderByCol = (u16)iCol;
        continue;
      }
    }
    if( sqlite3ExprIsInteger(pE2, &iCol) ){
      /* The ORDER BY term is an integer constant.  Again, set the column
      ** number so that sqlite3ResolveOrderGroupBy() will convert the
      ** order-by term to a copy of the result-set expression */
      if( iCol<1 || iCol>0xffff ){
        resolveOutOfRangeError(pParse, zType, i+1, nResult);
        return 1;
      }
      pItem->u.x.iOrderByCol = (u16)iCol;
      continue;
    }

    /* Otherwise, treat the ORDER BY term as an ordinary expression */
    pItem->u.x.iOrderByCol = 0;
    if( sqlite3ResolveExprNames(pNC, pE) ){
      return 1;
    }
    for(j=0; j<pSelect->pEList->nExpr; j++){
      if( sqlite3ExprCompare(pE, pSelect->pEList->a[j].pExpr, -1)==0 ){
        pItem->u.x.iOrderByCol = j+1;
      }
    }
  }
  return sqlite3ResolveOrderGroupBy(pParse, pSelect, pOrderBy, zType);
}